

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O3

void __thiscall bwtil::WaveletTree::loadFromFile(WaveletTree *this,FILE *fp)

{
  ulong uVar1;
  long lVar2;
  allocator_type local_59;
  undefined1 local_58 [16];
  pointer local_48;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_38;
  
  fread(this,8,1,(FILE *)fp);
  fread(&this->sigma,4,1,(FILE *)fp);
  fread(&this->log_sigma,4,1,(FILE *)fp);
  fread(&this->number_of_nodes,8,1,(FILE *)fp);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             local_58,this->number_of_nodes,&local_59);
  local_38.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  local_38.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  local_58 = ZEXT816(0) << 0x20;
  local_48 = (pointer)0x0;
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_38);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             local_58);
  if (this->number_of_nodes != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      succinct_bitvector::loadFromFile
                ((succinct_bitvector *)
                 ((long)&((this->nodes).
                          super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                          ._M_impl.super__Vector_impl_data._M_start)->n + lVar2),fp);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x60;
    } while (uVar1 < this->number_of_nodes);
  }
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&number_of_nodes, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		nodes = vector<succinct_bitvector>(number_of_nodes);

		for(ulint i=0;i<number_of_nodes;i++)
			nodes[i].loadFromFile(fp);

		numBytes++;//avoids "variable not used" warning

	}